

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

void __thiscall hmi::renderer::draw_rectangle(renderer *this,vec2f coords,vec2f size,color4f color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  vertex *in_XMM3_Qa;
  vertex vertices [4];
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 *local_b0;
  vec<float,_2UL> local_a8;
  vec<float,_2UL> local_a0;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_98;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_90;
  undefined1 local_88 [4];
  undefined1 local_28 [8];
  size_t local_20;
  vertex *local_18;
  vec_accessor local_10 [8];
  vec_accessor local_8 [8];
  
  local_20 = CONCAT44(in_XMM2_Db,in_XMM2_Da);
  local_b0 = local_88;
  local_18 = in_XMM3_Qa;
  do {
    vertex::vertex((vertex *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_b0 = local_b0 + 0x18;
  } while (local_b0 != local_28);
  fVar1 = vec_accessor::operator_cast_to_float(local_8);
  fVar2 = vec_accessor::operator_cast_to_float(local_8);
  vec<float,_2UL>::vec((vec<float,_2UL> *)&local_90.x,fVar1,fVar2);
  _local_88 = local_90;
  fVar1 = vec_accessor::operator_cast_to_float(local_8);
  fVar2 = vec_accessor::operator_cast_to_float(local_8);
  fVar3 = vec_accessor::operator_cast_to_float(local_10);
  vec<float,_2UL>::vec((vec<float,_2UL> *)&local_98.x,fVar1,fVar2 + fVar3);
  fVar1 = vec_accessor::operator_cast_to_float(local_8);
  fVar2 = vec_accessor::operator_cast_to_float(local_10);
  fVar3 = vec_accessor::operator_cast_to_float(local_8);
  fVar4 = vec_accessor::operator_cast_to_float(local_10);
  vec<float,_2UL>::vec(&local_a0,fVar1 + fVar2,fVar3 + fVar4);
  fVar1 = vec_accessor::operator_cast_to_float(local_8);
  fVar2 = vec_accessor::operator_cast_to_float(local_10);
  fVar3 = vec_accessor::operator_cast_to_float(local_8);
  vec<float,_2UL>::vec(&local_a8,fVar1 + fVar2,fVar3);
  draw((renderer *)local_98,local_18,local_20,(int)local_88._4_4_);
  return;
}

Assistant:

void renderer::draw_rectangle(vec2f coords, vec2f size, color4f color) {
    vertex vertices[4];

    vertices[0].position = { coords.x,              coords.y                };
    vertices[1].position = { coords.x,              coords.y + size.height  };
    vertices[2].position = { coords.x + size.width, coords.y + size.height  };
    vertices[3].position = { coords.x + size.width, coords.y                };

    vertices[0].color = vertices[1].color = vertices[2].color = vertices[3].color = color;

    draw(&vertices[0], 4, GL_LINE_LOOP);
  }